

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O3

ktx_error_code_e anon_unknown.dwarf_525a::StreambufStream::skip(ktxStream *str,ktx_size_t count)

{
  FILE *pFVar1;
  ktx_error_code_e kVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  undefined8 uStack_28;
  
  if (count != 0) {
    pFVar1 = (str->data).file;
    uStack_28 = in_RAX;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t  skip: ",9);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    uStack_28 = CONCAT17(0x42,(undefined7)uStack_28);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)((long)&uStack_28 + 7),1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    lVar4 = (**(code **)(**(long **)(pFVar1 + 8) + 0x20))
                      (*(long **)(pFVar1 + 8),0,1,*(undefined4 *)(pFVar1 + 0x10));
    lVar5 = (**(code **)(**(long **)(pFVar1 + 8) + 0x20))
                      (*(long **)(pFVar1 + 8),count,1,*(undefined4 *)(pFVar1 + 0x10));
    kVar2 = KTX_FILE_SEEK_ERROR;
    if (lVar5 < lVar4) {
      kVar2 = KTX_SUCCESS;
    }
    return kVar2;
  }
  return KTX_SUCCESS;
}

Assistant:

static KTX_error_code skip(ktxStream* str, ktx_size_t count)
    {
        auto self = parent(str);
        if (count == 0)
        {
            return KTX_SUCCESS;
        }
        std::cerr << "\t  skip: " << count << 'B' << std::endl;

        const std::streampos curpos = self->_streambuf->pubseekoff(0, std::ios::cur, self->_seek_mode);
        const std::streampos newpos = self->_streambuf->pubseekoff(std::streamoff(count), std::ios::cur, self->_seek_mode);
        return (curpos > newpos) ? KTX_SUCCESS : KTX_FILE_SEEK_ERROR;
    }